

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PalindromeTester.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint uVar3;
  int iVar4;
  char *__s;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  printf("%s","Enter a 5 digit number: ");
  __isoc99_scanf("%d",(long)&uStack_38 + 4);
  iVar4 = 1;
  do {
    if (((int)uStack_38._4_4_ < 0x2711) || (0x1869e < (int)uStack_38._4_4_)) {
      puts("You did not provide a 5 digit number!!!");
      printf("%s","Enter a 5 digit number: ");
      __isoc99_scanf("%d",(long)&uStack_38 + 4);
    }
    else {
      uVar3 = uStack_38._4_4_ / 10000;
      uVar1 = uStack_38._4_4_ % 10000;
      uVar2 = (uVar1 % 1000) % 100;
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      if ((uVar3 == uVar2 % 10) && (uVar1 / 1000 == uVar2 / 10)) {
        __s = "The given number is a palindrome!!!";
      }
      else {
        __s = "Not a palindrome!!!";
      }
      puts(__s);
      iVar4 = -1;
    }
  } while (iVar4 != -1);
  return 0;
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;

    printf("%s", "Enter a 5 digit number: ");
    scanf("%d", &number);
    while (flag != -1) {
        if (number > 10000) {
            if (number < 99999) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                number = number % 100;
                numC = number / 10;
                numD = number % 10;
                if (numA == numD) {
                    if (numB == numC) {
                        puts("The given number is a palindrome!!!");

                    }
                    else
                        puts("Not a palindrome!!!");

                }
                else
                    puts("Not a palindrome!!!");

                flag = -1;

            }
            else {
                puts("You did not provide a 5 digit number!!!");
                printf("%s", "Enter a 5 digit number: ");
                scanf("%d", &number);

            }

        }
        else {
            puts("You did not provide a 5 digit number!!!");
            printf("%s", "Enter a 5 digit number: ");
            scanf("%d", &number);

        }

    }

    return 0;

}